

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter-mip-test.h
# Opt level: O2

bool __thiscall
mip_converter_test::MIPInstance::Objective::operator==(Objective *this,Objective *obj)

{
  Sense SVar1;
  Sense SVar2;
  pointer pdVar3;
  bool bVar4;
  size_t i;
  ulong uVar5;
  size_t i_1;
  
  SVar1 = this->sense_;
  SVar2 = obj->sense_;
  bVar4 = SparseVec::operator==(&this->le_,&obj->le_);
  if (SVar1 != SVar2) {
    puts("Diff sense");
  }
  if (!bVar4) {
    puts("Diff coefs");
    for (uVar5 = 0;
        pdVar3 = (this->le_).c_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
        uVar5 < (ulong)((long)(this->le_).c_.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pdVar3 >> 3);
        uVar5 = uVar5 + 1) {
      printf(" %d:%f",pdVar3[uVar5],
             (ulong)(uint)(this->le_).v_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar5]);
    }
    putchar(10);
    for (uVar5 = 0;
        pdVar3 = (obj->le_).c_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
        uVar5 < (ulong)((long)(obj->le_).c_.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pdVar3 >> 3);
        uVar5 = uVar5 + 1) {
      printf(" %d:%f",pdVar3[uVar5],
             (ulong)(uint)(obj->le_).v_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar5]);
    }
    putchar(10);
  }
  return SVar1 == SVar2 && bVar4;
}

Assistant:

bool operator==(const Objective& obj) const {
      bool eq1 = sense_==obj.sense_;
      bool eq2 = le_==obj.le_;
      if (!eq1)
        printf("Diff sense\n");
      if (!eq2) {
        printf("Diff coefs\n");
        for (size_t i=0; i<le_.size(); ++i) {
          printf(" %d:%f", le_.v_[i], le_.c_[i]);
        }
        printf("\n");
        for (size_t i=0; i<obj.le_.size(); ++i) {
          printf(" %d:%f", obj.le_.v_[i], obj.le_.c_[i]);
        }
        printf("\n");
      }
      return eq1 && eq2;
    }